

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  undefined8 *puVar12;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m128 _p128_2;
  __m256 _p256_2;
  int i_2;
  __m256 _b256_2;
  __m256 _a256_2;
  __m128 _b128_2;
  __m128 _a128_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_1;
  __m256 _p256_1;
  int j;
  __m256 _b256_1;
  __m256 _a256_1;
  __m128 _b128_1;
  __m128 _a128_1;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int size_1;
  __m128 _b128;
  __m128 _a128;
  __m128 _p128;
  __m256 _b256;
  __m256 _a256;
  __m256 _p256;
  int i;
  int size;
  float *bptr;
  float *aptr;
  float *ptr;
  int elempack;
  int c;
  int d;
  int h;
  int w;
  int dims;
  Mat *m;
  undefined1 local_ac0 [28];
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined1 local_a20 [28];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  int local_964;
  float *local_8a0;
  int local_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  int local_844;
  float *local_7c0;
  int local_7b8;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  int local_720;
  float *local_718;
  float *local_710;
  float *local_708;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  
  iVar11 = (int)in_RSI[5];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar8 = in_RSI[6];
  iVar4 = *(int *)((long)in_RSI + 0x34);
  lVar9 = in_RSI[7];
  iVar5 = (int)in_RSI[3];
  if (iVar11 == 1) {
    local_708 = (float *)*in_RSI;
    local_710 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
    local_718 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240);
    iVar10 = iVar3 * iVar5;
    for (local_720 = 0; local_720 + 7 < iVar10; local_720 = local_720 + 8) {
      local_740._0_4_ = (float)*(undefined8 *)local_708;
      local_740._4_4_ = (float)((ulong)*(undefined8 *)local_708 >> 0x20);
      uStack_738._0_4_ = (float)*(undefined8 *)(local_708 + 2);
      uStack_738._4_4_ = (float)((ulong)*(undefined8 *)(local_708 + 2) >> 0x20);
      uStack_730._0_4_ = (float)*(undefined8 *)(local_708 + 4);
      uStack_730._4_4_ = (float)((ulong)*(undefined8 *)(local_708 + 4) >> 0x20);
      uStack_728._0_4_ = (float)*(undefined8 *)(local_708 + 6);
      uStack_728._4_4_ = (float)((ulong)*(undefined8 *)(local_708 + 6) >> 0x20);
      local_240 = (float)*(undefined8 *)local_718;
      fStack_23c = (float)((ulong)*(undefined8 *)local_718 >> 0x20);
      fStack_238 = (float)*(undefined8 *)(local_718 + 2);
      fStack_234 = (float)((ulong)*(undefined8 *)(local_718 + 2) >> 0x20);
      fStack_230 = (float)*(undefined8 *)(local_718 + 4);
      fStack_22c = (float)((ulong)*(undefined8 *)(local_718 + 4) >> 0x20);
      fStack_228 = (float)*(undefined8 *)(local_718 + 6);
      local_300 = (float)*(undefined8 *)local_710;
      fStack_2fc = (float)((ulong)*(undefined8 *)local_710 >> 0x20);
      fStack_2f8 = (float)*(undefined8 *)(local_710 + 2);
      fStack_2f4 = (float)((ulong)*(undefined8 *)(local_710 + 2) >> 0x20);
      fStack_2f0 = (float)*(undefined8 *)(local_710 + 4);
      fStack_2ec = (float)((ulong)*(undefined8 *)(local_710 + 4) >> 0x20);
      fStack_2e8 = (float)*(undefined8 *)(local_710 + 6);
      fStack_2e4 = (float)((ulong)*(undefined8 *)(local_710 + 6) >> 0x20);
      local_740 = CONCAT44(local_740._4_4_ * fStack_23c + fStack_2fc,
                           (float)local_740 * local_240 + local_300);
      uStack_738 = CONCAT44(uStack_738._4_4_ * fStack_234 + fStack_2f4,
                            (float)uStack_738 * fStack_238 + fStack_2f8);
      uStack_730 = CONCAT44(uStack_730._4_4_ * fStack_22c + fStack_2ec,
                            (float)uStack_730 * fStack_230 + fStack_2f0);
      uStack_728 = CONCAT44(uStack_728._4_4_ + fStack_2e4,
                            (float)uStack_728 * fStack_228 + fStack_2e8);
      *(undefined8 *)local_708 = local_740;
      *(undefined8 *)(local_708 + 2) = uStack_738;
      *(undefined8 *)(local_708 + 4) = uStack_730;
      *(undefined8 *)(local_708 + 6) = uStack_728;
      local_708 = local_708 + 8;
      local_710 = local_710 + 8;
      local_718 = local_718 + 8;
    }
    for (; local_720 + 3 < iVar10; local_720 = local_720 + 4) {
      local_110 = (float)*(undefined8 *)local_708;
      fStack_10c = (float)((ulong)*(undefined8 *)local_708 >> 0x20);
      fStack_108 = (float)*(undefined8 *)(local_708 + 2);
      fStack_104 = (float)((ulong)*(undefined8 *)(local_708 + 2) >> 0x20);
      local_120 = (float)*(undefined8 *)local_718;
      fStack_11c = (float)((ulong)*(undefined8 *)local_718 >> 0x20);
      fStack_118 = (float)*(undefined8 *)(local_718 + 2);
      fStack_114 = (float)((ulong)*(undefined8 *)(local_718 + 2) >> 0x20);
      local_180 = (float)*(undefined8 *)local_710;
      fStack_17c = (float)((ulong)*(undefined8 *)local_710 >> 0x20);
      fStack_178 = (float)*(undefined8 *)(local_710 + 2);
      fStack_174 = (float)((ulong)*(undefined8 *)(local_710 + 2) >> 0x20);
      local_790 = CONCAT44(fStack_10c * fStack_11c + fStack_17c,local_110 * local_120 + local_180);
      uStack_788 = CONCAT44(fStack_104 * fStack_114 + fStack_174,
                            fStack_108 * fStack_118 + fStack_178);
      *(undefined8 *)local_708 = local_790;
      *(undefined8 *)(local_708 + 2) = uStack_788;
      local_708 = local_708 + 4;
      local_710 = local_710 + 4;
      local_718 = local_718 + 4;
    }
    for (; local_720 < iVar10; local_720 = local_720 + 1) {
      *local_708 = *local_718 * *local_708 + *local_710;
      local_708 = local_708 + 1;
      local_710 = local_710 + 1;
      local_718 = local_718 + 1;
    }
  }
  if (iVar11 == 2) {
    iVar10 = iVar3 * iVar5;
    for (local_7b8 = 0; local_7b8 < (int)lVar8; local_7b8 = local_7b8 + 1) {
      local_7c0 = (float *)(*in_RSI +
                           (long)*(int *)((long)in_RSI + 0x2c) * (long)local_7b8 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_7b8 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_7b8 * 4);
      if (iVar5 == 4) {
        puVar12 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_7b8 << 2) * 4);
        uVar6 = *puVar12;
        uVar7 = puVar12[1];
        puVar12 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_7b8 << 2) * 4);
        local_9e0 = *puVar12;
        uStack_9d8 = puVar12[1];
      }
      else {
        uVar6 = CONCAT44(fVar1,fVar1);
        uVar7 = CONCAT44(fVar1,fVar1);
        local_9e0 = CONCAT44(fVar2,fVar2);
        uStack_9d8 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar13 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_7b8 << 3) * 4);
        local_a20 = SUB3228(*(undefined1 (*) [32])
                             (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                             (long)(local_7b8 << 3) * 4),0);
      }
      else {
        auVar13._8_8_ = uVar7;
        auVar13._0_8_ = uVar6;
        auVar13._24_8_ = uVar7;
        auVar13._16_8_ = uVar6;
        auVar14._8_8_ = uStack_9d8;
        auVar14._0_8_ = local_9e0;
        auVar14._24_8_ = uStack_9d8;
        auVar14._16_8_ = local_9e0;
        local_a20 = auVar14._0_28_;
      }
      for (local_844 = 0; local_844 + 7 < iVar10; local_844 = local_844 + 8) {
        local_880._0_4_ = (float)*(undefined8 *)local_7c0;
        local_880._4_4_ = (float)((ulong)*(undefined8 *)local_7c0 >> 0x20);
        uStack_878._0_4_ = (float)*(undefined8 *)(local_7c0 + 2);
        uStack_878._4_4_ = (float)((ulong)*(undefined8 *)(local_7c0 + 2) >> 0x20);
        uStack_870._0_4_ = (float)*(undefined8 *)(local_7c0 + 4);
        uStack_870._4_4_ = (float)((ulong)*(undefined8 *)(local_7c0 + 4) >> 0x20);
        uStack_868._0_4_ = (float)*(undefined8 *)(local_7c0 + 6);
        uStack_868._4_4_ = (float)((ulong)*(undefined8 *)(local_7c0 + 6) >> 0x20);
        local_200 = local_a20._0_4_;
        fStack_1fc = local_a20._4_4_;
        fStack_1f8 = local_a20._8_4_;
        fStack_1f4 = local_a20._12_4_;
        fStack_1f0 = local_a20._16_4_;
        fStack_1ec = local_a20._20_4_;
        fStack_1e8 = local_a20._24_4_;
        local_2c0 = auVar13._0_4_;
        fStack_2bc = auVar13._4_4_;
        fStack_2b8 = auVar13._8_4_;
        fStack_2b4 = auVar13._12_4_;
        fStack_2b0 = auVar13._16_4_;
        fStack_2ac = auVar13._20_4_;
        fStack_2a8 = auVar13._24_4_;
        fStack_2a4 = auVar13._28_4_;
        local_880 = CONCAT44(local_880._4_4_ * fStack_1fc + fStack_2bc,
                             (float)local_880 * local_200 + local_2c0);
        uStack_878 = CONCAT44(uStack_878._4_4_ * fStack_1f4 + fStack_2b4,
                              (float)uStack_878 * fStack_1f8 + fStack_2b8);
        uStack_870 = CONCAT44(uStack_870._4_4_ * fStack_1ec + fStack_2ac,
                              (float)uStack_870 * fStack_1f0 + fStack_2b0);
        uStack_868 = CONCAT44(uStack_868._4_4_ + fStack_2a4,
                              (float)uStack_868 * fStack_1e8 + fStack_2a8);
        *(undefined8 *)local_7c0 = local_880;
        *(undefined8 *)(local_7c0 + 2) = uStack_878;
        *(undefined8 *)(local_7c0 + 4) = uStack_870;
        *(undefined8 *)(local_7c0 + 6) = uStack_868;
        local_7c0 = local_7c0 + 8;
      }
      for (; local_844 + 3 < iVar10; local_844 = local_844 + 4) {
        local_f0 = (float)*(undefined8 *)local_7c0;
        fStack_ec = (float)((ulong)*(undefined8 *)local_7c0 >> 0x20);
        fStack_e8 = (float)*(undefined8 *)(local_7c0 + 2);
        fStack_e4 = (float)((ulong)*(undefined8 *)(local_7c0 + 2) >> 0x20);
        local_100 = (float)local_9e0;
        fStack_fc = (float)((ulong)local_9e0 >> 0x20);
        fStack_f8 = (float)uStack_9d8;
        fStack_f4 = (float)((ulong)uStack_9d8 >> 0x20);
        local_160 = (float)uVar6;
        fStack_15c = (float)((ulong)uVar6 >> 0x20);
        fStack_158 = (float)uVar7;
        fStack_154 = (float)((ulong)uVar7 >> 0x20);
        local_890 = CONCAT44(fStack_ec * fStack_fc + fStack_15c,local_f0 * local_100 + local_160);
        uStack_888 = CONCAT44(fStack_e4 * fStack_f4 + fStack_154,fStack_e8 * fStack_f8 + fStack_158)
        ;
        *(undefined8 *)local_7c0 = local_890;
        *(undefined8 *)(local_7c0 + 2) = uStack_888;
        local_7c0 = local_7c0 + 4;
      }
      for (; local_844 < iVar10; local_844 = local_844 + 1) {
        *local_7c0 = fVar2 * *local_7c0 + fVar1;
        local_7c0 = local_7c0 + 1;
      }
    }
  }
  if ((iVar11 == 3) || (iVar11 == 4)) {
    iVar11 = iVar3 * (int)lVar8 * iVar4 * iVar5;
    for (local_898 = 0; local_898 < (int)lVar9; local_898 = local_898 + 1) {
      local_8a0 = (float *)(*in_RSI + in_RSI[8] * (long)local_898 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_898 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_898 * 4);
      if (iVar5 == 4) {
        puVar12 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_898 << 2) * 4);
        uVar6 = *puVar12;
        uVar7 = puVar12[1];
        puVar12 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_898 << 2) * 4);
        local_a70 = *puVar12;
        uStack_a68 = puVar12[1];
      }
      else {
        uVar6 = CONCAT44(fVar1,fVar1);
        uVar7 = CONCAT44(fVar1,fVar1);
        local_a70 = CONCAT44(fVar2,fVar2);
        uStack_a68 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar15 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_898 << 3) * 4);
        local_ac0 = SUB3228(*(undefined1 (*) [32])
                             (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                             (long)(local_898 << 3) * 4),0);
      }
      else {
        auVar15._8_8_ = uVar7;
        auVar15._0_8_ = uVar6;
        auVar15._24_8_ = uVar7;
        auVar15._16_8_ = uVar6;
        auVar16._8_8_ = uStack_a68;
        auVar16._0_8_ = local_a70;
        auVar16._24_8_ = uStack_a68;
        auVar16._16_8_ = local_a70;
        local_ac0 = auVar16._0_28_;
      }
      for (local_964 = 0; local_964 + 7 < iVar11; local_964 = local_964 + 8) {
        local_9a0._0_4_ = (float)*(undefined8 *)local_8a0;
        local_9a0._4_4_ = (float)((ulong)*(undefined8 *)local_8a0 >> 0x20);
        uStack_998._0_4_ = (float)*(undefined8 *)(local_8a0 + 2);
        uStack_998._4_4_ = (float)((ulong)*(undefined8 *)(local_8a0 + 2) >> 0x20);
        uStack_990._0_4_ = (float)*(undefined8 *)(local_8a0 + 4);
        uStack_990._4_4_ = (float)((ulong)*(undefined8 *)(local_8a0 + 4) >> 0x20);
        uStack_988._0_4_ = (float)*(undefined8 *)(local_8a0 + 6);
        uStack_988._4_4_ = (float)((ulong)*(undefined8 *)(local_8a0 + 6) >> 0x20);
        local_1c0 = local_ac0._0_4_;
        fStack_1bc = local_ac0._4_4_;
        fStack_1b8 = local_ac0._8_4_;
        fStack_1b4 = local_ac0._12_4_;
        fStack_1b0 = local_ac0._16_4_;
        fStack_1ac = local_ac0._20_4_;
        fStack_1a8 = local_ac0._24_4_;
        local_280 = auVar15._0_4_;
        fStack_27c = auVar15._4_4_;
        fStack_278 = auVar15._8_4_;
        fStack_274 = auVar15._12_4_;
        fStack_270 = auVar15._16_4_;
        fStack_26c = auVar15._20_4_;
        fStack_268 = auVar15._24_4_;
        fStack_264 = auVar15._28_4_;
        local_9a0 = CONCAT44(local_9a0._4_4_ * fStack_1bc + fStack_27c,
                             (float)local_9a0 * local_1c0 + local_280);
        uStack_998 = CONCAT44(uStack_998._4_4_ * fStack_1b4 + fStack_274,
                              (float)uStack_998 * fStack_1b8 + fStack_278);
        uStack_990 = CONCAT44(uStack_990._4_4_ * fStack_1ac + fStack_26c,
                              (float)uStack_990 * fStack_1b0 + fStack_270);
        uStack_988 = CONCAT44(uStack_988._4_4_ + fStack_264,
                              (float)uStack_988 * fStack_1a8 + fStack_268);
        *(undefined8 *)local_8a0 = local_9a0;
        *(undefined8 *)(local_8a0 + 2) = uStack_998;
        *(undefined8 *)(local_8a0 + 4) = uStack_990;
        *(undefined8 *)(local_8a0 + 6) = uStack_988;
        local_8a0 = local_8a0 + 8;
      }
      for (; local_964 + 3 < iVar11; local_964 = local_964 + 4) {
        local_d0 = (float)*(undefined8 *)local_8a0;
        fStack_cc = (float)((ulong)*(undefined8 *)local_8a0 >> 0x20);
        fStack_c8 = (float)*(undefined8 *)(local_8a0 + 2);
        fStack_c4 = (float)((ulong)*(undefined8 *)(local_8a0 + 2) >> 0x20);
        local_e0 = (float)local_a70;
        fStack_dc = (float)((ulong)local_a70 >> 0x20);
        fStack_d8 = (float)uStack_a68;
        fStack_d4 = (float)((ulong)uStack_a68 >> 0x20);
        local_140 = (float)uVar6;
        fStack_13c = (float)((ulong)uVar6 >> 0x20);
        fStack_138 = (float)uVar7;
        fStack_134 = (float)((ulong)uVar7 >> 0x20);
        local_9b0 = CONCAT44(fStack_cc * fStack_dc + fStack_13c,local_d0 * local_e0 + local_140);
        uStack_9a8 = CONCAT44(fStack_c4 * fStack_d4 + fStack_134,fStack_c8 * fStack_d8 + fStack_138)
        ;
        *(undefined8 *)local_8a0 = local_9b0;
        *(undefined8 *)(local_8a0 + 2) = uStack_9a8;
        local_8a0 = local_8a0 + 4;
      }
      for (; local_964 < iVar11; local_964 = local_964 + 1) {
        *local_8a0 = fVar2 * *local_8a0 + fVar1;
        local_8a0 = local_8a0 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}